

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.hh
# Opt level: O0

shared_ptr<kratos::PackedStruct> __thiscall
kratos::VarPackedStruct::packed_struct(VarPackedStruct *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  shared_ptr<kratos::PackedStruct> sVar1;
  VarPackedStruct *this_local;
  
  std::shared_ptr<kratos::PackedStruct>::shared_ptr
            ((shared_ptr<kratos::PackedStruct> *)this,
             (shared_ptr<kratos::PackedStruct> *)(in_RSI + 0x278));
  sVar1.super___shared_ptr<kratos::PackedStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<kratos::PackedStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<kratos::PackedStruct>)
         sVar1.super___shared_ptr<kratos::PackedStruct,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

[[nodiscard]] std::shared_ptr<PackedStruct> packed_struct() const override { return struct_; }